

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_e2e2::MovieState::parse_handler(MovieState *this)

{
  PacketQueue<14680064UL> *__mutex;
  size_t *psVar1;
  AVMediaType AVar2;
  pthread_mutex_t *ppVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  AVFormatContext *pAVar7;
  ostream *poVar8;
  long lVar9;
  int *piVar10;
  _Elt_pointer pAVar11;
  undefined8 uVar12;
  deque<AVPacket,_std::allocator<AVPacket>_> *this_00;
  lock_guard<std::mutex> _;
  lock_guard<std::mutex> __1;
  ulong uVar13;
  unique_lock<std::mutex> lock_1;
  SDL_Event evt;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_128;
  uint local_118;
  uint local_114;
  deque<AVPacket,_std::allocator<AVPacket>_> *local_110;
  deque<AVPacket,_std::allocator<AVPacket>_> *local_108;
  pthread_mutex_t *local_100;
  AVPacket local_f8;
  condition_variable *local_98;
  condition_variable *local_90;
  unique_lock<std::mutex> local_88 [2];
  uint local_64;
  
  pAVar7 = (this->mFormatCtx)._M_t.
           super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
           super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
           super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
  if (pAVar7->nb_streams == 0) {
    uVar4 = 0xffffffff;
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = 0xffffffff;
    uVar13 = 0;
    uVar4 = 0xffffffff;
    do {
      AVar2 = pAVar7->streams[uVar13]->codecpar->codec_type;
      if (AVar2 == AVMEDIA_TYPE_VIDEO) {
        if (((anonymous_namespace)::DisableVideo == '\0') && ((int)uVar5 < 0)) {
          uVar5 = streamComponentOpen(this,(uint)uVar13);
        }
      }
      else if ((AVar2 == AVMEDIA_TYPE_AUDIO) && ((int)uVar4 < 0)) {
        uVar4 = streamComponentOpen(this,(uint)uVar13);
      }
      uVar13 = uVar13 + 1;
      pAVar7 = (this->mFormatCtx)._M_t.
               super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
               _M_t.
               super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
               super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
    } while (uVar13 < pAVar7->nb_streams);
  }
  if ((int)(uVar5 & uVar4) < 0) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->mFilename)._M_dataplus._M_p,
                        (this->mFilename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": could not open codecs",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    LOCK();
    (this->mQuit)._M_base._M_i = true;
    UNLOCK();
  }
  lVar9 = av_gettime();
  (this->mClockBase).__r = lVar9 + 750000;
  if (-1 < (int)uVar4) {
    local_88[0]._M_device = (mutex_type *)0x0;
    local_f8.buf = (AVBufferRef *)operator_new(0x20);
    *(undefined ***)local_f8.buf = &PTR___State_0010ec60;
    *(AudioState **)(local_f8.buf + 8) = &this->mAudio;
    *(code **)(local_f8.buf + 0x10) = AudioState::handler;
    *(long *)(local_f8.buf + 0x18) = 0;
    std::thread::_M_start_thread(local_88,&local_f8,0);
    if (local_f8.buf != (AVBufferRef *)0x0) {
      (**(code **)(*(long *)local_f8.buf + 8))();
    }
    if ((this->mAudioThread)._M_id._M_thread != 0) goto LAB_001071df;
    (this->mAudioThread)._M_id._M_thread = (native_handle_type)local_88[0]._M_device;
  }
  local_118 = uVar4;
  if (-1 < (int)uVar5) {
    local_88[0]._M_device = (mutex_type *)0x0;
    local_f8.buf = (AVBufferRef *)operator_new(0x20);
    *(undefined ***)local_f8.buf = &PTR___State_0010eca0;
    *(VideoState **)(local_f8.buf + 8) = &this->mVideo;
    *(code **)(local_f8.buf + 0x10) = VideoState::handler;
    *(long *)(local_f8.buf + 0x18) = 0;
    std::thread::_M_start_thread(local_88,&local_f8,0);
    if (local_f8.buf != (AVBufferRef *)0x0) {
      (**(code **)(*(long *)local_f8.buf + 8))();
    }
    if ((this->mVideoThread)._M_id._M_thread != 0) {
LAB_001071df:
      std::terminate();
    }
    (this->mVideoThread)._M_id._M_thread = (native_handle_type)local_88[0]._M_device;
  }
  local_100 = (pthread_mutex_t *)&(this->mAudio).mPackets;
  __mutex = &(this->mVideo).mPackets;
  local_114 = uVar5;
  if (((this->mQuit)._M_base._M_i & 1U) == 0) {
    local_110 = &(this->mAudio).mPackets.mPackets;
    local_98 = &(this->mAudio).mPackets.mCondVar;
    local_108 = &(this->mVideo).mPackets.mPackets;
    local_90 = &(this->mVideo).mPackets.mCondVar;
    do {
      iVar6 = av_read_frame((this->mFormatCtx)._M_t.
                            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                            .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,local_88);
      ppVar3 = local_100;
      if (iVar6 < 0) break;
      if (local_64 == local_114) {
LAB_00106d9b:
        if (((this->mQuit)._M_base._M_i & 1U) == 0) {
          local_128._M_owns = false;
          local_128._M_device = &__mutex->mMutex;
          std::unique_lock<std::mutex>::lock(&local_128);
          local_128._M_owns = true;
          if (0xdfffff < (this->mVideo).mPackets.mTotalSize) goto code_r0x00106dcd;
          local_f8.duration = 0;
          local_f8.pos = 0;
          local_f8.side_data = (AVPacketSideData *)0x0;
          local_f8.side_data_elems = 0;
          local_f8._60_4_ = 0;
          local_f8.size = 0;
          local_f8.stream_index = 0;
          local_f8.flags = 0;
          local_f8._44_4_ = 0;
          local_f8.dts = 0;
          local_f8.data = (uint8_t *)0x0;
          local_f8.buf = (AVBufferRef *)0x0;
          local_f8.pts = 0;
          local_f8.convergence_duration = 0;
          pAVar11 = (this->mVideo).mPackets.mPackets.
                    super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pAVar11 ==
              *(_Elt_pointer *)
               ((long)&(this->mVideo).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x10) + -1) {
            std::deque<AVPacket,_std::allocator<AVPacket>_>::_M_push_back_aux<AVPacket>
                      (local_108,&local_f8);
            pAVar11 = (this->mVideo).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
          }
          else {
            pAVar11->duration = 0;
            pAVar11->pos = 0;
            pAVar11->side_data = (AVPacketSideData *)0x0;
            *(undefined8 *)&pAVar11->side_data_elems = 0;
            pAVar11->size = 0;
            pAVar11->stream_index = 0;
            *(undefined8 *)&pAVar11->flags = 0;
            pAVar11->dts = 0;
            pAVar11->data = (uint8_t *)0x0;
            pAVar11->buf = (AVBufferRef *)0x0;
            pAVar11->pts = 0;
            pAVar11->convergence_duration = 0;
            pAVar11 = (this->mVideo).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur + 1;
            (this->mVideo).mPackets.mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar11;
          }
          if (pAVar11 ==
              *(_Elt_pointer *)
               ((long)&(this->mVideo).mPackets.mPackets.
                       super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                       super__Deque_impl_data._M_finish + 8)) {
            pAVar11 = (*(_Map_pointer *)
                        ((long)&(this->mVideo).mPackets.mPackets.
                                super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
          }
          iVar6 = av_packet_ref(pAVar11 + -1,local_88);
          this_00 = local_108;
          if (iVar6 == 0) {
            pAVar11 = (this->mVideo).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (pAVar11 ==
                *(_Elt_pointer *)
                 ((long)&(this->mVideo).mPackets.mPackets.
                         super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
              pAVar11 = (*(_Map_pointer *)
                          ((long)&(this->mVideo).mPackets.mPackets.
                                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                  super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
            }
            psVar1 = &(this->mVideo).mPackets.mTotalSize;
            *psVar1 = *psVar1 + (ulong)(uint)pAVar11[-1].size;
            std::unique_lock<std::mutex>::~unique_lock(&local_128);
LAB_00107081:
            std::condition_variable::notify_one();
          }
          else {
LAB_00107035:
            std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_back(this_00);
            std::unique_lock<std::mutex>::~unique_lock(&local_128);
          }
        }
        goto LAB_00107086;
      }
      if (local_64 == local_118) {
LAB_00106e12:
        if (((this->mQuit)._M_base._M_i & 1U) == 0) {
          local_128._M_device = (mutex_type *)ppVar3;
          local_128._M_owns = false;
          std::unique_lock<std::mutex>::lock(&local_128);
          local_128._M_owns = true;
          if ((this->mAudio).mPackets.mTotalSize < 0x200000) {
            local_f8.duration = 0;
            local_f8.pos = 0;
            local_f8.side_data = (AVPacketSideData *)0x0;
            local_f8.side_data_elems = 0;
            local_f8._60_4_ = 0;
            local_f8.size = 0;
            local_f8.stream_index = 0;
            local_f8.flags = 0;
            local_f8._44_4_ = 0;
            local_f8.dts = 0;
            local_f8.data = (uint8_t *)0x0;
            local_f8.buf = (AVBufferRef *)0x0;
            local_f8.pts = 0;
            local_f8.convergence_duration = 0;
            pAVar11 = (this->mAudio).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (pAVar11 ==
                *(_Elt_pointer *)
                 ((long)&(this->mAudio).mPackets.mPackets.
                         super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x10) + -1) {
              std::deque<AVPacket,_std::allocator<AVPacket>_>::_M_push_back_aux<AVPacket>
                        (local_110,&local_f8);
              pAVar11 = (this->mAudio).mPackets.mPackets.
                        super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
            }
            else {
              pAVar11->duration = 0;
              pAVar11->pos = 0;
              pAVar11->side_data = (AVPacketSideData *)0x0;
              *(undefined8 *)&pAVar11->side_data_elems = 0;
              pAVar11->size = 0;
              pAVar11->stream_index = 0;
              *(undefined8 *)&pAVar11->flags = 0;
              pAVar11->dts = 0;
              pAVar11->data = (uint8_t *)0x0;
              pAVar11->buf = (AVBufferRef *)0x0;
              pAVar11->pts = 0;
              pAVar11->convergence_duration = 0;
              pAVar11 = (this->mAudio).mPackets.mPackets.
                        super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur + 1;
              (this->mAudio).mPackets.mPackets.
              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_cur = pAVar11;
            }
            if (pAVar11 ==
                *(_Elt_pointer *)
                 ((long)&(this->mAudio).mPackets.mPackets.
                         super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
              pAVar11 = (*(_Map_pointer *)
                          ((long)&(this->mAudio).mPackets.mPackets.
                                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                  super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
            }
            iVar6 = av_packet_ref(pAVar11 + -1,local_88);
            this_00 = local_110;
            if (iVar6 != 0) goto LAB_00107035;
            pAVar11 = (this->mAudio).mPackets.mPackets.
                      super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (pAVar11 ==
                *(_Elt_pointer *)
                 ((long)&(this->mAudio).mPackets.mPackets.
                         super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
              pAVar11 = (*(_Map_pointer *)
                          ((long)&(this->mAudio).mPackets.mPackets.
                                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                                  super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
            }
            psVar1 = &(this->mAudio).mPackets.mTotalSize;
            *psVar1 = *psVar1 + (ulong)(uint)pAVar11[-1].size;
            std::unique_lock<std::mutex>::~unique_lock(&local_128);
            goto LAB_00107081;
          }
          std::unique_lock<std::mutex>::~unique_lock(&local_128);
          local_f8.buf = (AVBufferRef *)0x0;
          local_f8.pts = 100000000;
          do {
            iVar6 = nanosleep((timespec *)&local_f8,(timespec *)&local_f8);
            if (iVar6 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          goto LAB_00106e12;
        }
      }
LAB_00107086:
      av_packet_unref(local_88);
    } while (((this->mQuit)._M_base._M_i & 1U) == 0);
  }
  if ((this->mVideo).mCodecCtx._M_t.
      super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
      super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar6 != 0) goto LAB_001071e4;
    (this->mVideo).mPackets.mFinished = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::condition_variable::notify_one();
  }
  ppVar3 = local_100;
  if ((this->mAudio).mCodecCtx._M_t.
      super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
      super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
    iVar6 = pthread_mutex_lock(local_100);
    if (iVar6 != 0) {
LAB_001071e4:
      uVar12 = std::__throw_system_error(iVar6);
      std::unique_lock<std::mutex>::~unique_lock(&local_128);
      _Unwind_Resume(uVar12);
    }
    (this->mAudio).mPackets.mFinished = true;
    pthread_mutex_unlock(ppVar3);
    std::condition_variable::notify_one();
  }
  if ((this->mVideoThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->mAudioThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  LOCK();
  (this->mVideo).mEOS._M_base._M_i = true;
  UNLOCK();
  local_88[0]._M_device = &(this->mVideo).mPictQMutex;
  local_88[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_88);
  local_88[0]._M_owns = true;
  if (((this->mVideo).mFinalUpdate._M_base._M_i & 1U) == 0) {
    do {
      std::condition_variable::wait((unique_lock *)&(this->mVideo).mPictQCond);
    } while (((this->mVideo).mFinalUpdate._M_base._M_i & 1U) == 0);
  }
  std::unique_lock<std::mutex>::unlock(local_88);
  local_f8.pts = 0;
  local_f8.size = 0;
  local_f8.stream_index = 0;
  local_f8.flags = 0;
  local_f8._44_4_ = 0;
  local_f8.dts = 0;
  local_f8.data = (uint8_t *)0x0;
  local_f8.side_data = (AVPacketSideData *)0x0;
  local_f8.buf = (AVBufferRef *)0x8000;
  SDL_PushEvent();
  std::unique_lock<std::mutex>::~unique_lock(local_88);
  return 0;
code_r0x00106dcd:
  std::unique_lock<std::mutex>::~unique_lock(&local_128);
  local_f8.buf = (AVBufferRef *)0x0;
  local_f8.pts = 100000000;
  do {
    iVar6 = nanosleep((timespec *)&local_f8,(timespec *)&local_f8);
    if (iVar6 != -1) break;
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  goto LAB_00106d9b;
}

Assistant:

int MovieState::parse_handler()
{
    auto &audio_queue = mAudio.mPackets;
    auto &video_queue = mVideo.mPackets;

    int video_index{-1};
    int audio_index{-1};

    /* Find the first video and audio streams */
    for(unsigned int i{0u};i < mFormatCtx->nb_streams;i++)
    {
        auto codecpar = mFormatCtx->streams[i]->codecpar;
        if(codecpar->codec_type == AVMEDIA_TYPE_VIDEO && !DisableVideo && video_index < 0)
            video_index = streamComponentOpen(i);
        else if(codecpar->codec_type == AVMEDIA_TYPE_AUDIO && audio_index < 0)
            audio_index = streamComponentOpen(i);
    }

    if(video_index < 0 && audio_index < 0)
    {
        std::cerr<< mFilename<<": could not open codecs" <<std::endl;
        mQuit = true;
    }

    /* Set the base time 750ms ahead of the current av time. */
    mClockBase = get_avtime() + milliseconds{750};

    if(audio_index >= 0)
        mAudioThread = std::thread{std::mem_fn(&AudioState::handler), &mAudio};
    if(video_index >= 0)
        mVideoThread = std::thread{std::mem_fn(&VideoState::handler), &mVideo};

    /* Main packet reading/dispatching loop */
    while(!mQuit.load(std::memory_order_relaxed))
    {
        AVPacket packet;
        if(av_read_frame(mFormatCtx.get(), &packet) < 0)
            break;

        /* Copy the packet into the queue it's meant for. */
        if(packet.stream_index == video_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !video_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }
        else if(packet.stream_index == audio_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !audio_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }

        av_packet_unref(&packet);
    }
    /* Finish the queues so the receivers know nothing more is coming. */
    if(mVideo.mCodecCtx) video_queue.setFinished();
    if(mAudio.mCodecCtx) audio_queue.setFinished();

    /* all done - wait for it */
    if(mVideoThread.joinable())
        mVideoThread.join();
    if(mAudioThread.joinable())
        mAudioThread.join();

    mVideo.mEOS = true;
    std::unique_lock<std::mutex> lock{mVideo.mPictQMutex};
    while(!mVideo.mFinalUpdate)
        mVideo.mPictQCond.wait(lock);
    lock.unlock();

    SDL_Event evt{};
    evt.user.type = FF_MOVIE_DONE_EVENT;
    SDL_PushEvent(&evt);

    return 0;
}